

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase257::~TestCase257(TestCase257 *this)

{
  TestCase257 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Stringify, PrettyPrint) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = false,\n"
      "  int8Field = 0,\n"
      "  int16Field = 0,\n"
      "  int32Field = 0,\n"
      "  int64Field = 0,\n"
      "  uInt8Field = 0,\n"
      "  uInt16Field = 0,\n"
      "  uInt32Field = 0,\n"
      "  uInt64Field = 0,\n"
      "  float32Field = 0,\n"
      "  float64Field = 0,\n"
      "  enumField = foo,\n"
      "  interfaceField = void )", prettyPrint(root).flatten());

  initTestMessage(root);

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = true,\n"
      "  int8Field = -123,\n"
      "  int16Field = -12345,\n"
      "  int32Field = -12345678,\n"
      "  int64Field = -123456789012345,\n"
      "  uInt8Field = 234,\n"
      "  uInt16Field = 45678,\n"
      "  uInt32Field = 3456789012,\n"
      "  uInt64Field = 12345678901234567890,\n"
      "  float32Field = 1234.5,\n"
      "  float64Field = -1.23e47,\n"
      "  textField = \"foo\",\n"
      "  dataField = \"bar\",\n"
      "  structField = (\n"
      "    voidField = void,\n"
      "    boolField = true,\n"
      "    int8Field = -12,\n"
      "    int16Field = 3456,\n"
      "    int32Field = -78901234,\n"
      "    int64Field = 56789012345678,\n"
      "    uInt8Field = 90,\n"
      "    uInt16Field = 1234,\n"
      "    uInt32Field = 56789012,\n"
      "    uInt64Field = 345678901234567890,\n"
      "    float32Field = -1.25e-10,\n"
      "    float64Field = 345,\n"
      "    textField = \"baz\",\n"
      "    dataField = \"qux\",\n"
      "    structField = (\n"
      "      voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"nested\",\n"
      "      structField = (\n"
      "        voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"really nested\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    enumField = baz,\n"
      "    interfaceField = void,\n"
      "    voidList = [void, void, void],\n"
      "    boolList = [false, true, false, true, true],\n"
      "    int8List = [12, -34, -128, 127],\n"
      "    int16List = [1234, -5678, -32768, 32767],\n"
      "    int32List = [12345678, -90123456, -2147483648, 2147483647],\n"
      "    int64List = [123456789012345, -678901234567890, "
                       "-9223372036854775808, 9223372036854775807],\n"
      "    uInt8List = [12, 34, 0, 255],\n"
      "    uInt16List = [1234, 5678, 0, 65535],\n"
      "    uInt32List = [12345678, 90123456, 0, 4294967295],\n"
      "    uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615],\n"
      "    float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-37],\n"
      "    float64List = [0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306],\n"
      "    textList = [\"quux\", \"corge\", \"grault\"],\n"
      "    dataList = [\"garply\", \"waldo\", \"fred\"],\n"
      "    structList = [\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 1\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 2\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 3\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ) ],\n"
      "    enumList = [qux, bar, grault] ),\n"
      "  enumField = corge,\n"
      "  interfaceField = void,\n"
      "  voidList = [void, void, void, void, void, void],\n"
      "  boolList = [true, false, false, true],\n"
      "  int8List = [111, -111],\n"
      "  int16List = [11111, -11111],\n"
      "  int32List = [111111111, -111111111],\n"
      "  int64List = [1111111111111111111, -1111111111111111111],\n"
      "  uInt8List = [111, 222],\n"
      "  uInt16List = [33333, 44444],\n"
      "  uInt32List = [3333333333],\n"
      "  uInt64List = [11111111111111111111],\n"
      "  float32List = [5555.5, inf, -inf, nan],\n"
      "  float64List = [7777.75, inf, -inf, nan],\n"
      "  textList = [\"plugh\", \"xyzzy\", \"thud\"],\n"
      "  dataList = [\"oops\", \"exhausted\", \"rfc3092\"],\n"
      "  structList = [\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 1\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 2\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 3\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ) ],\n"
      "  enumList = [foo, garply] )",
      prettyPrint(root).flatten());
}